

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O1

void __thiscall YAML::Stream::StreamInUtf32(Stream *this)

{
  uchar uVar1;
  int i;
  undefined8 in_RAX;
  long lVar2;
  ulong ch;
  int (*paiVar3) [4];
  uchar bytes [4];
  undefined8 uStack_18;
  
  paiVar3 = StreamInUtf32::indexes;
  if (this->m_charSet == utf32be) {
    paiVar3 = (int (*) [4])0x76bdb0;
  }
  uStack_18 = in_RAX;
  uVar1 = GetNextByte(this);
  uStack_18._0_5_ = CONCAT14(uVar1,(undefined4)uStack_18);
  uVar1 = GetNextByte(this);
  uStack_18._0_6_ = CONCAT15(uVar1,(undefined5)uStack_18);
  uVar1 = GetNextByte(this);
  uStack_18._0_7_ = CONCAT16(uVar1,(undefined6)uStack_18);
  uVar1 = GetNextByte(this);
  uStack_18 = CONCAT17(uVar1,(undefined7)uStack_18);
  if (*(int *)(this->m_input + *(long *)(*(long *)this->m_input + -0x18) + 0x20) != 0) {
    return;
  }
  lVar2 = 0;
  ch = 0;
  do {
    ch = (ulong)*(byte *)((long)&uStack_18 + (long)(*paiVar3)[lVar2] + 4) | ch << 8;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  QueueUnicodeCodepoint(&this->m_readahead,ch);
  return;
}

Assistant:

void Stream::StreamInUtf32() const {
  static int indexes[2][4] = {{3, 2, 1, 0}, {0, 1, 2, 3}};

  unsigned long ch = 0;
  unsigned char bytes[4];
  int* pIndexes = (m_charSet == utf32be) ? indexes[1] : indexes[0];

  bytes[0] = GetNextByte();
  bytes[1] = GetNextByte();
  bytes[2] = GetNextByte();
  bytes[3] = GetNextByte();
  if (!m_input.good()) {
    return;
  }

  for (int i = 0; i < 4; ++i) {
    ch <<= 8;
    ch |= bytes[pIndexes[i]];
  }

  QueueUnicodeCodepoint(m_readahead, ch);
}